

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseValueTypeList
          (WastParser *this,TypeVector *out_type_list,ReferenceVars *type_vars)

{
  undefined8 this_00;
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  int __c;
  int __c_00;
  Var *out_type;
  Type local_128;
  Var local_120;
  ReferenceVar local_d8;
  Type local_88;
  Type local_80;
  int local_78;
  Enum local_74;
  undefined1 local_70 [8];
  Var type;
  ReferenceVars *type_vars_local;
  TypeVector *out_type_list_local;
  WastParser *this_local;
  
  type.field_2._24_8_ = type_vars;
  do {
    bVar1 = PeekMatchRefType(this);
    if ((!bVar1) && (bVar1 = PeekMatch(this,First_Type,0), !bVar1)) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    Var::Var((Var *)local_70);
    out_type = (Var *)local_70;
    local_74 = (Enum)ParseValueType(this,out_type);
    bVar1 = Failed((Result)local_74);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_78 = 1;
    }
    else {
      bVar1 = Var::is_index((Var *)local_70);
      if (bVar1) {
        pcVar2 = Var::index((Var *)local_70,(char *)out_type,__c);
        if ((uint)pcVar2 < 0xffffffc0) {
          pcVar2 = Var::index((Var *)local_70,(char *)out_type,__c_00);
          Type::Type(&local_88,Reference,(Index)pcVar2);
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back(out_type_list,&local_88);
        }
        else {
          pcVar2 = Var::index((Var *)local_70,(char *)out_type,__c_00);
          Type::Type(&local_80,(int32_t)pcVar2);
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back(out_type_list,&local_80);
        }
      }
      else {
        bVar1 = Var::is_name((Var *)local_70);
        if (!bVar1) {
          __assert_fail("type.is_name()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                        ,0x3b3,
                        "Result wabt::WastParser::ParseValueTypeList(TypeVector *, ReferenceVars *)"
                       );
        }
        bVar1 = Features::function_references_enabled(&this->options_->features);
        this_00 = type.field_2._24_8_;
        if (!bVar1) {
          __assert_fail("options_->features.function_references_enabled()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                        ,0x3b4,
                        "Result wabt::WastParser::ParseValueTypeList(TypeVector *, ReferenceVars *)"
                       );
        }
        sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(out_type_list);
        Var::Var(&local_120,(Var *)local_70);
        ReferenceVar::ReferenceVar(&local_d8,(uint32_t)sVar3,&local_120);
        std::vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
        ::push_back((vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                     *)this_00,&local_d8);
        ReferenceVar::~ReferenceVar(&local_d8);
        Var::~Var(&local_120);
        Type::Type(&local_128,Reference,0xffffffff);
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back(out_type_list,&local_128);
      }
      local_78 = 0;
    }
    Var::~Var((Var *)local_70);
    if (local_78 != 0) {
      return (Result)this_local._4_4_;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseValueTypeList(TypeVector* out_type_list,
                                      ReferenceVars* type_vars) {
  WABT_TRACE(ParseValueTypeList);
  while (true) {
    if (!PeekMatchRefType() && !PeekMatch(TokenType::ValueType)) {
      break;
    }

    Var type;
    CHECK_RESULT(ParseValueType(&type));

    if (type.is_index()) {
      // TODO: Incorrect values can be misinterpreted by the parser.
      if (type.index() >= static_cast<Index>(Type::Void)) {
        out_type_list->push_back(Type(type.index()));
      } else {
        out_type_list->push_back(Type(Type::Reference, type.index()));
      }
    } else {
      assert(type.is_name());
      assert(options_->features.function_references_enabled());
      type_vars->push_back(ReferenceVar(out_type_list->size(), type));
      out_type_list->push_back(Type(Type::Reference, kInvalidIndex));
    }
  }

  return Result::Ok;
}